

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O3

int getLargestRec(int match,int *ids,int sx,int sz,Pos *p0,Pos *p1)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  void *__ptr;
  long lVar4;
  int *piVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  int *piVar11;
  int iVar12;
  int iVar13;
  
  iVar3 = sz;
  if (sz < sx) {
    iVar3 = sx;
  }
  __ptr = calloc((long)iVar3,0xc);
  if (sx < 1) {
    iVar3 = 0;
  }
  else {
    uVar6 = (ulong)(uint)sx;
    piVar11 = ids + uVar6;
    iVar12 = 0;
    iVar3 = 0;
    uVar7 = uVar6;
    do {
      piVar11 = piVar11 + -1;
      if (0 < sz) {
        lVar4 = 0;
        piVar5 = piVar11;
        do {
          iVar10 = 0;
          if (*piVar5 == match) {
            iVar10 = *(int *)((long)__ptr + lVar4) + 1;
          }
          *(int *)((long)__ptr + lVar4) = iVar10;
          piVar5 = piVar5 + uVar6;
          lVar4 = lVar4 + 0xc;
        } while ((ulong)(uint)sz * 0xc != lVar4);
        if (0 < sz) {
          uVar9 = 0;
          iVar10 = 0;
          do {
            iVar1 = *(int *)((long)__ptr + uVar9 * 0xc);
            iVar8 = (int)uVar9;
            if (iVar10 < iVar1) {
              *(int *)((long)__ptr + (long)iVar12 * 0xc + 4) = iVar8;
              *(int *)((long)__ptr + (long)iVar12 * 0xc + 8) = iVar10;
              iVar10 = iVar1;
              iVar12 = iVar12 + 1;
            }
            else if (iVar1 != iVar10) {
              lVar4 = (long)iVar12;
              piVar5 = (int *)((long)__ptr + lVar4 * 0xc + -4);
              do {
                iVar12 = piVar5[-1];
                iVar13 = (iVar8 - iVar12) * iVar10;
                if (iVar3 < iVar13) {
                  p0->x = (int)(uVar7 - 1);
                  p0->z = iVar12;
                  p1->x = iVar10 + (int)uVar7 + -2;
                  p1->z = iVar8 + -1;
                  iVar3 = iVar13;
                }
                iVar10 = *piVar5;
                piVar5 = piVar5 + -3;
                lVar4 = lVar4 + -1;
              } while (iVar1 < iVar10);
              iVar10 = iVar1;
              iVar12 = (int)lVar4 + 1;
              if (iVar1 == 0) {
                iVar12 = (int)lVar4;
              }
            }
            uVar9 = uVar9 + 1;
          } while (uVar9 != (uint)sz);
        }
      }
      bVar2 = 1 < (long)uVar7;
      uVar7 = uVar7 - 1;
    } while (bVar2);
  }
  free(__ptr);
  return iVar3;
}

Assistant:

int getLargestRec(int match, const int *ids, int sx, int sz, Pos *p0, Pos *p1)
{
    typedef struct { int n, j, w; } entry_t;
    entry_t *meta = (entry_t*) calloc(sx > sz ? sx : sz, sizeof(*meta));
    int i, j, w, m, ret;
    ret = m = 0;

    for (i = sx-1; i >= 0; i--)
    {
        for (j = 0; j < sz; j++)
        {
            if (ids[j*sx + i] == match)
                meta[j].n++;
            else
                meta[j].n = 0;
        }
        for (w = j = 0; j < sz; j++)
        {
            int n = meta[j].n;
            if (n > w)
            {
                meta[m].j = j;
                meta[m].w = w;
                m++;
                w = n;
            }
            if (n == w)
                continue;
            do
            {
                entry_t e = meta[--m];
                int area = w * (j - e.j);
                if (area > ret)
                {
                    p0->x = i; p0->z = e.j;
                    p1->x = i+w-1; p1->z = j-1;
                    ret = area;
                }
                w = e.w;
            }
            while (n < w);
            if ((w = n))
                m++;
        }
    }
    free(meta);
    return ret;
}